

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete
          (ValueFunctionDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *p,
          JointPolicyDiscretePure *jp)

{
  _func_int **pp_Var1;
  _func_int **in_RDX;
  unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_RSI;
  ValueFunction *in_RDI;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffd0;
  key_equal *in_stack_ffffffffffffffd8;
  hasher *in_stack_ffffffffffffffe0;
  
  ValueFunction::ValueFunction(in_RDI);
  in_RDI->_vptr_ValueFunction = (_func_int **)&PTR__ValueFunctionDecPOMDPDiscrete_00d070f8;
  std::allocator<std::pair<const_unsigned_int,_double>_>::allocator
            ((allocator<std::pair<const_unsigned_int,_double>_> *)0x8d771d);
  boost::unordered::
  unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::unordered_map(in_RSI,(size_type)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                  in_stack_ffffffffffffffd0);
  std::allocator<std::pair<const_unsigned_int,_double>_>::~allocator
            ((allocator<std::pair<const_unsigned_int,_double>_> *)0x8d7747);
  in_RDI[0xd]._vptr_ValueFunction = (_func_int **)in_RSI;
  in_RDI[0xe]._vptr_ValueFunction = in_RDX;
  in_RDI[1]._vptr_ValueFunction = (_func_int **)in_RSI;
  in_RDI[2]._vptr_ValueFunction = in_RDX;
  pp_Var1 = (_func_int **)
            PlanningUnitMADPDiscrete::GetNrJointObservationHistories
                      ((PlanningUnitMADPDiscrete *)in_RDI[1]._vptr_ValueFunction);
  in_RDI[3]._vptr_ValueFunction = pp_Var1;
  pp_Var1 = (_func_int **)
            PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x8d7797);
  in_RDI[4]._vptr_ValueFunction = pp_Var1;
  pp_Var1 = (_func_int **)PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffffa0);
  in_RDI[5]._vptr_ValueFunction = pp_Var1;
  pp_Var1 = (_func_int **)PlanningUnit::GetHorizon((PlanningUnit *)in_RDI[1]._vptr_ValueFunction);
  in_RDI[6]._vptr_ValueFunction = pp_Var1;
  return;
}

Assistant:

ValueFunctionDecPOMDPDiscrete::ValueFunctionDecPOMDPDiscrete(
    PlanningUnitDecPOMDPDiscrete* p , JointPolicyDiscretePure* jp):
    _m_planningUnitDecPOMDPDiscrete(p), //BAS is never used, _m_pu used instead
    _m_jointPolicyDiscretePure(jp)
{
    _m_pu = p;
    _m_jpol = jp;
    _m_nrJOH = _m_pu->GetNrJointObservationHistories();
    _m_nrJO = _m_pu->GetNrJointObservations();
    _m_nrS =  _m_pu->GetNrStates();
    _m_h = _m_pu->GetHorizon();

}